

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int target_set_timeout(TARGET_HANDLE target,seconds timeout_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE timeout_amqp_value;
  TARGET_INSTANCE *target_instance;
  int result;
  seconds timeout_value_local;
  TARGET_HANDLE target_local;
  
  if (target == (TARGET_HANDLE)0x0) {
    target_instance._0_4_ = 0x371d;
  }
  else {
    item_value = amqpvalue_create_seconds(timeout_value);
    if (item_value == (AMQP_VALUE)0x0) {
      target_instance._0_4_ = 0x3725;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(target->composite_value,3,item_value);
      if (iVar1 == 0) {
        target_instance._0_4_ = 0;
      }
      else {
        target_instance._0_4_ = 0x372b;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)target_instance;
}

Assistant:

int target_set_timeout(TARGET_HANDLE target, seconds timeout_value)
{
    int result;

    if (target == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target;
        AMQP_VALUE timeout_amqp_value = amqpvalue_create_seconds(timeout_value);
        if (timeout_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(target_instance->composite_value, 3, timeout_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(timeout_amqp_value);
        }
    }

    return result;
}